

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Padding_x86::forward_int8(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int *piVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined4 uVar19;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined4 uVar27;
  undefined1 uVar28;
  undefined1 uVar30;
  undefined1 uVar32;
  undefined1 uVar34;
  undefined8 uVar35;
  uint uVar42;
  int iVar43;
  ulong uVar44;
  ulong uVar45;
  uint uVar46;
  undefined8 *puVar47;
  ulong uVar48;
  undefined8 *puVar49;
  int unaff_EBP;
  undefined8 *puVar50;
  uint uVar51;
  int iVar52;
  int iVar53;
  undefined8 *puVar54;
  int iVar55;
  long lVar56;
  ulong uVar57;
  int iVar58;
  int iVar59;
  long lVar60;
  long lVar61;
  int iVar62;
  long lVar63;
  long lVar64;
  bool bVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  Mat m;
  Mat m_1;
  Mat local_148;
  ulong local_100;
  ulong local_f8;
  int local_ec;
  ulong local_e8;
  long local_e0;
  ulong local_d8;
  ulong local_d0;
  Mat local_c8;
  Option *local_78;
  ulong local_70;
  uint local_64;
  ulong local_60;
  size_t local_58;
  void *local_50;
  long local_48;
  ulong local_40;
  Mat *local_38;
  undefined4 uVar13;
  undefined3 uVar15;
  undefined2 uVar17;
  undefined4 uVar21;
  undefined3 uVar23;
  undefined2 uVar25;
  undefined4 uVar29;
  undefined3 uVar31;
  undefined2 uVar33;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined3 uVar38;
  undefined1 uVar39;
  undefined2 uVar40;
  undefined1 uVar41;
  
  iVar43 = bottom_blob->elempack;
  if (iVar43 == 8) {
    uVar42 = bottom_blob->w;
    local_70 = (ulong)(uint)bottom_blob->h;
    local_ec = bottom_blob->d;
    local_d0 = (ulong)(uint)bottom_blob->c;
    iVar1 = bottom_blob->dims;
    local_d8 = bottom_blob->elemsize;
    if (iVar1 == 1) {
      uVar46 = (this->super_Padding).left;
      uVar51 = uVar46 + uVar42 * 8 + (this->super_Padding).right;
      bVar65 = ((uVar46 | uVar51) & 7) == 0;
      bVar6 = (this->super_Padding).type == 0;
      if (bVar65 && bVar6) {
        Mat::create(top_blob,(int)uVar51 >> 3,local_d8 & 0xfffffffffffffff8,8,opt->blob_allocator);
        unaff_EBP = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar44 = (ulong)(this->super_Padding).value;
          iVar52 = (this->super_Padding).left;
          iVar53 = (this->super_Padding).right;
          iVar55 = iVar52 + 7;
          if (-1 < iVar52) {
            iVar55 = iVar52;
          }
          iVar52 = iVar53 + 7;
          if (-1 < iVar53) {
            iVar52 = iVar53;
          }
          unaff_EBP = 0;
          padding_constant_pack8_int8_sse
                    (bottom_blob,top_blob,0,0,iVar55 >> 3,iVar52 >> 3,
                     uVar44 << 0x38 | uVar44 << 0x30 | uVar44 << 0x28 |
                     uVar44 << 0x20 | uVar44 << 0x18 | uVar44 << 0x10 | uVar44 << 8 | uVar44);
        }
      }
      if (bVar65 && bVar6) {
        return unaff_EBP;
      }
    }
    if (iVar1 == 2) {
      uVar46 = (this->super_Padding).top;
      uVar51 = uVar46 + (int)local_70 * 8 + (this->super_Padding).bottom;
      bVar65 = ((uVar46 | uVar51) & 7) == 0;
      bVar6 = (this->super_Padding).type == 0;
      if (bVar65 && bVar6) {
        Mat::create(top_blob,(this->super_Padding).left + uVar42 + (this->super_Padding).right,
                    (int)uVar51 >> 3,local_d8 & 0xfffffffffffffff8,8,opt->blob_allocator);
        unaff_EBP = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar44 = (ulong)(this->super_Padding).value;
          iVar52 = (this->super_Padding).top;
          iVar53 = (this->super_Padding).bottom;
          iVar55 = iVar52 + 7;
          if (-1 < iVar52) {
            iVar55 = iVar52;
          }
          iVar52 = iVar53 + 7;
          if (-1 < iVar53) {
            iVar52 = iVar53;
          }
          padding_constant_pack8_int8_sse
                    (bottom_blob,top_blob,iVar55 >> 3,iVar52 >> 3,(this->super_Padding).left,
                     (this->super_Padding).right,
                     uVar44 << 0x38 | uVar44 << 0x30 | uVar44 << 0x28 |
                     uVar44 << 0x20 | uVar44 << 0x18 | uVar44 << 0x10 | uVar44 << 8 | uVar44);
          unaff_EBP = 0;
        }
      }
      if (bVar65 && bVar6) {
        return unaff_EBP;
      }
    }
    uVar44 = local_d0;
    iVar52 = (int)local_d0;
    if (iVar1 == 3) {
      uVar46 = (this->super_Padding).front;
      uVar51 = uVar46 + iVar52 * 8 + (this->super_Padding).behind;
      bVar65 = (uVar51 & 7) == 0;
      iVar53 = 1;
      if (bVar65) {
        iVar53 = 8;
      }
      bVar6 = true;
      if (bVar65 && (uVar46 & 7) == 0) {
        local_e8 = (ulong)uVar42;
        if ((uVar51 == iVar52 * 8) || ((this->super_Padding).type == 0)) {
          iVar55 = (int)((long)(int)uVar51 / (long)iVar53);
          Mat::create(top_blob,(this->super_Padding).left + uVar42 + (this->super_Padding).right,
                      (this->super_Padding).top + (int)local_70 + (this->super_Padding).bottom,
                      iVar55,(local_d8 >> 3) << bVar65 * '\x03',iVar53,opt->blob_allocator);
          unaff_EBP = -100;
          if (top_blob->data == (void *)0x0) {
LAB_0043611c:
            bVar6 = false;
            uVar42 = (uint)local_e8;
          }
          else {
            bVar6 = false;
            uVar42 = (uint)local_e8;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar2 = (this->super_Padding).front;
              iVar59 = iVar2 + 7;
              if (-1 < iVar2) {
                iVar59 = iVar2;
              }
              if (0 < iVar55) {
                local_64 = -(iVar59 >> 3);
                local_40 = (long)(int)uVar51 / (long)iVar53 & 0xffffffff;
                uVar57 = 0;
                local_100 = (ulong)local_64;
                auVar70 = _DAT_005f1070;
                local_78 = opt;
                do {
                  local_148.w = top_blob->w;
                  local_148.h = top_blob->h;
                  local_148.c = top_blob->d;
                  pvVar4 = top_blob->data;
                  local_148.elemsize = top_blob->elemsize;
                  puVar50 = (undefined8 *)
                            (top_blob->cstep * uVar57 * local_148.elemsize + (long)pvVar4);
                  local_148.elempack = top_blob->elempack;
                  local_148.allocator = top_blob->allocator;
                  local_148.refcount._0_4_ = 0;
                  local_148.refcount._4_4_ = 0;
                  local_148.d = 1;
                  local_148.dims = top_blob->dims + -1;
                  local_148.cstep =
                       (local_148.elemsize * (long)local_148.h * (long)local_148.w + 0xf &
                       0xfffffffffffffff0) / local_148.elemsize;
                  if (top_blob->dims == 4) {
                    local_148.cstep = (long)local_148.h * (long)local_148.w;
                  }
                  uVar45 = (ulong)(this->super_Padding).value;
                  uVar45 = uVar45 << 0x38 | uVar45 << 0x30 | uVar45 << 0x28 |
                           uVar45 << 0x20 | uVar45 << 0x18 | uVar45 << 0x10 | uVar45 << 8 | uVar45;
                  local_f8._0_4_ = (int)uVar57;
                  uVar42 = local_64 + (int)local_f8;
                  local_148.data = puVar50;
                  local_f8 = uVar57;
                  if ((int)uVar42 < 0 || (int)uVar44 <= (int)uVar42) {
                    uVar42 = local_148.c * (int)local_148.cstep;
                    if (0 < (int)uVar42) {
                      lVar63 = (ulong)uVar42 - 1;
                      auVar66._8_4_ = (int)lVar63;
                      auVar66._0_8_ = lVar63;
                      auVar66._12_4_ = (int)((ulong)lVar63 >> 0x20);
                      lVar63 = top_blob->cstep * local_148.elemsize * uVar57;
                      auVar66 = auVar66 ^ auVar70;
                      uVar57 = 0;
                      auVar69 = _DAT_005f1bd0;
                      do {
                        auVar68 = auVar69 ^ auVar70;
                        if ((bool)(~(auVar66._4_4_ < auVar68._4_4_ ||
                                    auVar66._0_4_ < auVar68._0_4_ && auVar68._4_4_ == auVar66._4_4_)
                                  & 1)) {
                          *(ulong *)((long)pvVar4 + uVar57 * 8 + lVar63) = uVar45;
                        }
                        if (auVar68._12_4_ <= auVar66._12_4_ &&
                            (auVar68._8_4_ <= auVar66._8_4_ || auVar68._12_4_ != auVar66._12_4_)) {
                          *(ulong *)((long)pvVar4 + uVar57 * 8 + lVar63 + 8) = uVar45;
                        }
                        uVar57 = uVar57 + 2;
                        lVar56 = auVar69._8_8_;
                        auVar69._0_8_ = auVar69._0_8_ + 2;
                        auVar69._8_8_ = lVar56 + 2;
                      } while ((uVar42 + 1 & 0xfffffffe) != uVar57);
                    }
                  }
                  else {
                    iVar52 = bottom_blob->w;
                    lVar63 = (long)iVar52;
                    iVar53 = bottom_blob->h;
                    local_c8.c = bottom_blob->d;
                    local_50 = bottom_blob->data;
                    local_c8.elemsize = bottom_blob->elemsize;
                    local_58 = bottom_blob->cstep;
                    puVar49 = (undefined8 *)(uVar42 * local_58 * local_c8.elemsize + (long)local_50)
                    ;
                    local_c8.elempack = bottom_blob->elempack;
                    local_c8.allocator = bottom_blob->allocator;
                    local_c8.refcount._0_4_ = 0;
                    local_c8.refcount._4_4_ = 0;
                    local_c8.d = 1;
                    uVar44 = iVar53 * lVar63;
                    local_c8.dims = bottom_blob->dims + -1;
                    local_c8.cstep =
                         (local_c8.elemsize * uVar44 + 0xf & 0xfffffffffffffff0) / local_c8.elemsize
                    ;
                    if (bottom_blob->dims == 4) {
                      local_c8.cstep = uVar44;
                    }
                    local_60 = local_c8.elemsize;
                    if ((this->super_Padding).type == 0) {
                      local_c8.data = puVar49;
                      local_c8.w = iVar52;
                      local_c8.h = iVar53;
                      padding_constant_pack8_int8_sse
                                (&local_c8,&local_148,(this->super_Padding).top,
                                 (this->super_Padding).bottom,(this->super_Padding).left,
                                 (this->super_Padding).right,uVar45);
                      auVar70 = _DAT_005f1070;
                    }
                    iVar55 = (this->super_Padding).type;
                    if (iVar55 == 2) {
                      iVar55 = (this->super_Padding).top;
                      iVar2 = (this->super_Padding).bottom;
                      uVar42 = (this->super_Padding).left;
                      lVar56 = (long)(int)uVar42;
                      uVar44 = (ulong)uVar42;
                      uVar46 = (this->super_Padding).right;
                      uVar57 = (ulong)uVar46;
                      lVar60 = (long)(iVar55 * iVar52);
                      if (iVar55 < 1) {
                        puVar49 = puVar49 + lVar60;
                      }
                      else {
                        lVar61 = local_58 * local_60 * local_100;
                        lVar64 = lVar61 + lVar56 * 8 + lVar60 * 8 + (long)local_50;
                        puVar49 = (undefined8 *)(lVar61 + lVar60 * 8 + (long)local_50);
                        iVar59 = 0;
                        do {
                          if (0 < (int)uVar42) {
                            lVar60 = 0;
                            do {
                              *puVar50 = *(undefined8 *)(lVar64 + lVar60 * 8);
                              puVar50 = puVar50 + 1;
                              lVar60 = lVar60 + -1;
                            } while (-lVar60 != uVar44);
                          }
                          puVar47 = puVar49;
                          if (0 < iVar52) {
                            lVar61 = 0;
                            lVar60 = 0;
                            do {
                              puVar50[lVar60] = puVar49[lVar60];
                              lVar60 = lVar60 + 1;
                              lVar61 = lVar61 + -8;
                            } while (iVar52 != (int)lVar60);
                            puVar50 = (undefined8 *)((long)puVar50 - lVar61);
                            puVar47 = (undefined8 *)((long)puVar49 - lVar61);
                          }
                          if (0 < (int)uVar46) {
                            lVar60 = 0;
                            do {
                              *puVar50 = puVar47[lVar60 + -2];
                              puVar50 = puVar50 + 1;
                              lVar60 = lVar60 + -1;
                            } while (-lVar60 != uVar57);
                          }
                          puVar49 = puVar49 + -lVar63;
                          iVar59 = iVar59 + 1;
                          lVar64 = lVar64 + lVar63 * -8;
                        } while (iVar59 != iVar55);
                      }
                      if (0 < iVar53) {
                        iVar55 = 0;
                        do {
                          if (0 < (int)uVar42) {
                            lVar60 = 0;
                            do {
                              *puVar50 = puVar49[lVar56 + lVar60];
                              puVar50 = puVar50 + 1;
                              lVar60 = lVar60 + -1;
                            } while (-lVar60 != uVar44);
                          }
                          if (0 < iVar52) {
                            lVar60 = 0;
                            lVar64 = 0;
                            do {
                              puVar50[lVar64] = puVar49[lVar64];
                              lVar64 = lVar64 + 1;
                              lVar60 = lVar60 + -8;
                            } while (iVar52 != (int)lVar64);
                            puVar50 = (undefined8 *)((long)puVar50 - lVar60);
                            puVar49 = (undefined8 *)((long)puVar49 - lVar60);
                          }
                          if (0 < (int)uVar46) {
                            lVar60 = 0;
                            do {
                              *puVar50 = puVar49[lVar60 + -2];
                              puVar50 = puVar50 + 1;
                              lVar60 = lVar60 + -1;
                            } while (-lVar60 != uVar57);
                          }
                          iVar55 = iVar55 + 1;
                        } while (iVar55 != iVar53);
                      }
                      local_e0 = lVar63;
                      if (0 < iVar2) {
                        puVar47 = puVar49 + -(long)(iVar52 * 2);
                        puVar49 = puVar49 + (lVar56 - iVar52 * 2);
                        iVar55 = 0;
                        do {
                          if (0 < (int)uVar42) {
                            lVar56 = 0;
                            do {
                              *puVar50 = puVar49[lVar56];
                              puVar50 = puVar50 + 1;
                              lVar56 = lVar56 + -1;
                            } while (-lVar56 != uVar44);
                          }
                          puVar54 = puVar47;
                          if (0 < iVar52) {
                            lVar60 = 0;
                            lVar56 = 0;
                            do {
                              puVar50[lVar56] = puVar47[lVar56];
                              lVar56 = lVar56 + 1;
                              lVar60 = lVar60 + -8;
                            } while (iVar52 != (int)lVar56);
                            puVar50 = (undefined8 *)((long)puVar50 - lVar60);
                            puVar54 = (undefined8 *)((long)puVar47 - lVar60);
                          }
                          if (0 < (int)uVar46) {
                            lVar56 = 0;
                            do {
                              *puVar50 = puVar54[lVar56 + -2];
                              puVar50 = puVar50 + 1;
                              lVar56 = lVar56 + -1;
                            } while (-lVar56 != uVar57);
                          }
                          puVar47 = puVar47 + -lVar63;
                          iVar55 = iVar55 + 1;
                          puVar49 = puVar49 + -lVar63;
                        } while (iVar55 != iVar2);
                      }
                    }
                    else if (iVar55 == 1) {
                      iVar55 = (this->super_Padding).top;
                      iVar2 = (this->super_Padding).bottom;
                      iVar59 = (this->super_Padding).left;
                      iVar3 = (this->super_Padding).right;
                      if (0 < iVar55) {
                        lVar56 = local_58 * local_60 * local_100;
                        iVar58 = 0;
                        do {
                          iVar62 = iVar59;
                          if (0 < iVar59) {
                            do {
                              *puVar50 = *puVar49;
                              puVar50 = puVar50 + 1;
                              iVar62 = iVar62 + -1;
                            } while (iVar62 != 0);
                          }
                          puVar47 = puVar49;
                          if (0 < iVar52) {
                            lVar60 = 0;
                            lVar64 = 0;
                            do {
                              puVar50[lVar64] =
                                   *(undefined8 *)((long)local_50 + lVar64 * 8 + lVar56);
                              lVar64 = lVar64 + 1;
                              lVar60 = lVar60 + -8;
                            } while (iVar52 != (int)lVar64);
                            puVar50 = (undefined8 *)((long)puVar50 - lVar60);
                            puVar47 = (undefined8 *)((long)local_50 + (lVar56 - lVar60));
                          }
                          iVar62 = iVar3;
                          if (0 < iVar3) {
                            do {
                              *puVar50 = puVar47[-1];
                              puVar50 = puVar50 + 1;
                              iVar62 = iVar62 + -1;
                            } while (iVar62 != 0);
                          }
                          iVar58 = iVar58 + 1;
                        } while (iVar58 != iVar55);
                      }
                      if (0 < iVar53) {
                        iVar55 = 0;
                        do {
                          iVar58 = iVar59;
                          if (0 < iVar59) {
                            do {
                              *puVar50 = *puVar49;
                              puVar50 = puVar50 + 1;
                              iVar58 = iVar58 + -1;
                            } while (iVar58 != 0);
                          }
                          if (0 < iVar52) {
                            lVar56 = 0;
                            lVar60 = 0;
                            do {
                              puVar50[lVar60] = puVar49[lVar60];
                              lVar60 = lVar60 + 1;
                              lVar56 = lVar56 + -8;
                            } while (iVar52 != (int)lVar60);
                            puVar50 = (undefined8 *)((long)puVar50 - lVar56);
                            puVar49 = (undefined8 *)((long)puVar49 - lVar56);
                          }
                          iVar58 = iVar3;
                          if (0 < iVar3) {
                            do {
                              *puVar50 = puVar49[-1];
                              puVar50 = puVar50 + 1;
                              iVar58 = iVar58 + -1;
                            } while (iVar58 != 0);
                          }
                          iVar55 = iVar55 + 1;
                        } while (iVar55 != iVar53);
                      }
                      local_e0 = lVar63;
                      if (0 < iVar2) {
                        puVar49 = puVar49 + -lVar63;
                        iVar55 = 0;
                        do {
                          iVar58 = iVar59;
                          if (0 < iVar59) {
                            do {
                              *puVar50 = *puVar49;
                              puVar50 = puVar50 + 1;
                              iVar58 = iVar58 + -1;
                            } while (iVar58 != 0);
                          }
                          puVar47 = puVar49;
                          if (0 < iVar52) {
                            lVar60 = 0;
                            lVar56 = 0;
                            do {
                              puVar50[lVar56] = puVar49[lVar56];
                              lVar56 = lVar56 + 1;
                              lVar60 = lVar60 + -8;
                            } while (iVar52 != (int)lVar56);
                            puVar50 = (undefined8 *)((long)puVar50 - lVar60);
                            puVar47 = (undefined8 *)((long)puVar49 - lVar60);
                          }
                          iVar58 = iVar3;
                          if (0 < iVar3) {
                            do {
                              *puVar50 = puVar47[-1];
                              puVar50 = puVar50 + 1;
                              iVar58 = iVar58 + -1;
                            } while (iVar58 != 0);
                          }
                          iVar55 = iVar55 + 1;
                        } while (iVar55 != iVar2);
                      }
                    }
                    local_c8.cstep = 0;
                    local_c8.data = (void *)0x0;
                    local_c8.refcount._0_4_ = 0;
                    local_c8.refcount._4_4_ = 0;
                    local_c8.elemsize = 0;
                    local_c8.elempack = 0;
                    local_c8.dims = 0;
                    local_c8.w = 0;
                    local_c8.h = 0;
                    local_c8.d = 0;
                    local_c8.c = 0;
                    opt = local_78;
                    uVar44 = local_d0;
                    local_48 = (long)iVar53;
                  }
                  iVar52 = (int)uVar44;
                  piVar5 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_148.allocator == (Allocator *)0x0) {
                        if ((undefined8 *)local_148.data != (undefined8 *)0x0) {
                          free(local_148.data);
                          auVar70 = _DAT_005f1070;
                        }
                      }
                      else {
                        (*(local_148.allocator)->_vptr_Allocator[3])();
                        auVar70 = _DAT_005f1070;
                      }
                    }
                  }
                  local_148.cstep = 0;
                  local_148.data = (void *)0x0;
                  local_148.refcount._0_4_ = 0;
                  local_148.refcount._4_4_ = 0;
                  local_148.elemsize = 0;
                  local_148.elempack = 0;
                  local_148.dims = 0;
                  local_148.w = 0;
                  local_148.h = 0;
                  local_148.d = 0;
                  local_148.c = 0;
                  uVar57 = local_f8 + 1;
                  local_100 = (ulong)((int)local_100 + 1);
                } while (uVar57 != local_40);
                unaff_EBP = 0;
                goto LAB_0043611c;
              }
              unaff_EBP = 0;
            }
          }
        }
      }
      if (!bVar6) {
        return unaff_EBP;
      }
    }
    if (iVar1 == 4) {
      iVar1 = (this->super_Padding).type;
      if (iVar1 == 0) {
        uVar46 = (this->super_Padding).front + local_ec + (this->super_Padding).behind;
        Mat::create(top_blob,uVar42 + (this->super_Padding).left + (this->super_Padding).right,
                    (int)local_70 + (this->super_Padding).top + (this->super_Padding).bottom,uVar46,
                    iVar52,local_d8,8,opt->blob_allocator);
        unaff_EBP = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if (iVar52 < 1) {
            unaff_EBP = 0;
          }
          else {
            uVar44 = 0;
            auVar70 = _DAT_005f1070;
            local_78 = opt;
            local_38 = top_blob;
            do {
              if (0 < (int)uVar46) {
                uVar57 = (ulong)(this->super_Padding).value;
                uVar57 = uVar57 << 0x38 | uVar57 << 0x30 | uVar57 << 0x28 |
                         uVar57 << 0x20 | uVar57 << 0x18 | uVar57 << 0x10 | uVar57 << 8 | uVar57;
                uVar45 = 0;
                do {
                  local_148.w = top_blob->w;
                  local_148.h = top_blob->h;
                  local_148.elemsize = top_blob->elemsize;
                  local_148.elempack = top_blob->elempack;
                  local_148.allocator = top_blob->allocator;
                  local_148.cstep = (long)local_148.h * (long)local_148.w;
                  local_148.data =
                       (void *)((long)top_blob->data +
                               uVar45 * local_148.elemsize * local_148.cstep +
                               top_blob->cstep * uVar44 * local_148.elemsize);
                  local_148.refcount._0_4_ = 0;
                  local_148.refcount._4_4_ = 0;
                  local_148.dims = 2;
                  local_148.d = 1;
                  local_148.c = 1;
                  uVar42 = (int)uVar45 - (this->super_Padding).front;
                  if ((int)uVar42 < 0 || local_ec <= (int)uVar42) {
                    if (0 < (int)local_148.cstep) {
                      lVar63 = (local_148.cstep & 0xffffffff) - 1;
                      auVar67._8_4_ = (int)lVar63;
                      auVar67._0_8_ = lVar63;
                      auVar67._12_4_ = (int)((ulong)lVar63 >> 0x20);
                      auVar67 = auVar67 ^ auVar70;
                      uVar48 = 0;
                      auVar68 = _DAT_005f1bd0;
                      do {
                        auVar69 = auVar68 ^ auVar70;
                        if ((bool)(~(auVar67._4_4_ < auVar69._4_4_ ||
                                    auVar67._0_4_ < auVar69._0_4_ && auVar69._4_4_ == auVar67._4_4_)
                                  & 1)) {
                          *(ulong *)((long)local_148.data + uVar48 * 8) = uVar57;
                        }
                        if (auVar69._12_4_ <= auVar67._12_4_ &&
                            (auVar69._8_4_ <= auVar67._8_4_ || auVar69._12_4_ != auVar67._12_4_)) {
                          *(ulong *)((long)local_148.data + uVar48 * 8 + 8) = uVar57;
                        }
                        uVar48 = uVar48 + 2;
                        lVar63 = auVar68._8_8_;
                        auVar68._0_8_ = auVar68._0_8_ + 2;
                        auVar68._8_8_ = lVar63 + 2;
                      } while (((int)local_148.cstep + 1U & 0xfffffffe) != uVar48);
                    }
                  }
                  else {
                    local_c8.w = bottom_blob->w;
                    local_c8.h = bottom_blob->h;
                    local_c8.elemsize = bottom_blob->elemsize;
                    local_c8.elempack = bottom_blob->elempack;
                    local_c8.allocator = bottom_blob->allocator;
                    local_c8.cstep = (long)local_c8.h * (long)local_c8.w;
                    local_c8.data =
                         (void *)((long)bottom_blob->data +
                                 uVar42 * local_c8.elemsize * local_c8.cstep +
                                 bottom_blob->cstep * uVar44 * local_c8.elemsize);
                    local_c8.refcount._0_4_ = 0;
                    local_c8.refcount._4_4_ = 0;
                    local_c8.dims = 2;
                    local_c8.d = 1;
                    local_c8.c = 1;
                    padding_constant_pack8_int8_sse
                              (&local_c8,&local_148,(this->super_Padding).top,
                               (this->super_Padding).bottom,(this->super_Padding).left,
                               (this->super_Padding).right,uVar57);
                    auVar70 = _DAT_005f1070;
                    piVar5 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                    if (piVar5 != (int *)0x0) {
                      LOCK();
                      *piVar5 = *piVar5 + -1;
                      UNLOCK();
                      if (*piVar5 == 0) {
                        if (local_c8.allocator == (Allocator *)0x0) {
                          if (local_c8.data != (void *)0x0) {
                            free(local_c8.data);
                            auVar70 = _DAT_005f1070;
                          }
                        }
                        else {
                          (*(local_c8.allocator)->_vptr_Allocator[3])();
                          auVar70 = _DAT_005f1070;
                        }
                      }
                    }
                    local_c8.cstep = 0;
                    local_c8.data = (void *)0x0;
                    local_c8.refcount._0_4_ = 0;
                    local_c8.refcount._4_4_ = 0;
                    local_c8.elemsize = 0;
                    local_c8.elempack = 0;
                    local_c8.dims = 0;
                    local_c8.w = 0;
                    local_c8.h = 0;
                    local_c8.d = 0;
                    local_c8.c = 0;
                    top_blob = local_38;
                  }
                  piVar5 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_148.allocator == (Allocator *)0x0) {
                        if (local_148.data != (void *)0x0) {
                          free(local_148.data);
                          auVar70 = _DAT_005f1070;
                        }
                      }
                      else {
                        (*(local_148.allocator)->_vptr_Allocator[3])();
                        auVar70 = _DAT_005f1070;
                      }
                    }
                  }
                  uVar45 = uVar45 + 1;
                } while (uVar45 != uVar46);
              }
              uVar44 = uVar44 + 1;
            } while (uVar44 != local_d0);
            unaff_EBP = 0;
            opt = local_78;
          }
        }
      }
      if (iVar1 == 0) {
        return unaff_EBP;
      }
    }
  }
  local_148.data = bottom_blob->data;
  piVar5 = bottom_blob->refcount;
  local_148.refcount._0_4_ = SUB84(piVar5,0);
  local_148.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
  local_148.elemsize = bottom_blob->elemsize;
  local_148.elempack = bottom_blob->elempack;
  local_148.allocator = bottom_blob->allocator;
  uVar7 = bottom_blob->dims;
  uVar8 = bottom_blob->w;
  uVar9 = bottom_blob->h;
  uVar10 = bottom_blob->d;
  local_148.c = bottom_blob->c;
  local_148.cstep = bottom_blob->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  local_148.dims = uVar7;
  local_148.w = uVar8;
  local_148.h = uVar9;
  local_148.d = uVar10;
  if (iVar43 != 1) {
    local_c8.data = *(void **)opt;
    local_c8.elemsize = (size_t)opt->workspace_allocator;
    uVar11 = opt->openmp_blocktime;
    uVar12 = opt->use_winograd_convolution;
    uVar14 = opt->use_sgemm_convolution;
    uVar16 = opt->use_int8_inference;
    uVar18 = opt->use_vulkan_compute;
    uVar17 = CONCAT11(uVar18,uVar16);
    uVar15 = CONCAT21(uVar17,uVar14);
    uVar13 = CONCAT31(uVar15,uVar12);
    local_c8.allocator = *(Allocator **)&opt->use_bf16_storage;
    uVar19 = opt->vulkan_device_index;
    uVar20 = opt->use_reserved_1;
    uVar22 = opt->use_image_storage;
    uVar24 = opt->use_tensor_storage;
    uVar26 = opt->use_reserved_2;
    uVar25 = CONCAT11(uVar26,uVar24);
    uVar23 = CONCAT21(uVar25,uVar22);
    uVar21 = CONCAT31(uVar23,uVar20);
    uVar27 = opt->flush_denormals;
    uVar28 = opt->use_local_pool_allocator;
    uVar30 = opt->use_shader_local_memory;
    uVar32 = opt->use_cooperative_matrix;
    uVar34 = opt->use_winograd23_convolution;
    uVar33 = CONCAT11(uVar34,uVar32);
    uVar31 = CONCAT21(uVar33,uVar30);
    uVar29 = CONCAT31(uVar31,uVar28);
    uVar35._0_1_ = opt->use_winograd43_convolution;
    uVar35._1_1_ = opt->use_winograd63_convolution;
    uVar35._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar35._3_1_ = opt->use_fp16_uniform;
    uVar36 = opt->use_int8_uniform;
    uVar37 = opt->use_reserved_9;
    uVar39 = opt->use_reserved_10;
    uVar41 = opt->use_reserved_11;
    uVar40 = CONCAT11(uVar41,uVar39);
    uVar38 = CONCAT21(uVar40,uVar37);
    uVar35._4_4_ = CONCAT31(uVar38,uVar36);
    local_c8.c = (int)uVar35;
    local_c8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_c8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_c8.elempack = uVar11;
    local_c8._28_4_ = uVar13;
    local_c8.dims = uVar19;
    local_c8.w = uVar21;
    local_c8.h = uVar27;
    local_c8.d = uVar29;
    local_c8._60_4_ = uVar35._4_4_;
    convert_packing(bottom_blob,&local_148,1,(Option *)&local_c8);
    if (local_148.data == (void *)0x0 || (long)local_148.c * local_148.cstep == 0) {
      iVar43 = -100;
      goto LAB_00436243;
    }
  }
  iVar43 = Padding::forward(&this->super_Padding,&local_148,top_blob,opt);
LAB_00436243:
  piVar5 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar43;
}

Assistant:

int Padding_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}